

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

UniValue *
WriteUTXOSnapshot(UniValue *__return_storage_ptr__,Chainstate *chainstate,CCoinsViewCursor *pcursor,
                 CCoinsStats *maybe_stats,CBlockIndex *tip,AutoFile *afile,path *path,path *temppath
                 ,function<void_()> *interruption_point)

{
  MessageStartChars network_magic;
  long lVar1;
  string prefix;
  string str;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  string end_msg;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *__stream;
  size_t *written_coins_count_00;
  uint uVar5;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffad0;
  UniValue *pUVar6;
  int *val_05;
  undefined8 in_stack_fffffffffffffae0;
  CCoinsStats *pCVar7;
  undefined8 local_518;
  undefined8 uStack_510;
  vector<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_> coins;
  size_t written_coins_count;
  undefined1 local_4e8 [2] [40];
  string local_490 [32];
  UniValue local_470;
  string local_418 [32];
  UniValue local_3f8;
  string local_3a0 [32];
  UniValue local_380;
  string local_328 [32];
  base_blob<256u> local_308 [32];
  string local_2e8;
  UniValue local_2c8;
  string local_270 [32];
  UniValue local_250;
  string local_1f8 [32];
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8 [16];
  Coin coin;
  COutPoint key;
  SnapshotMetadata metadata;
  Txid last_hash;
  string local_d8;
  string local_b8 [32];
  Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> logging_timer58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"WriteUTXOSnapshot",(allocator<char> *)&local_2e8);
  CBlockIndex::GetBlockHash((uint256 *)&coin,tip);
  base_blob<256u>::ToString_abi_cxx11_((string *)&metadata,(base_blob<256u> *)&coin);
  std::filesystem::__cxx11::path::string((string *)&key,&path->super_path);
  std::filesystem::__cxx11::path::string((string *)&last_hash,&temppath->super_path);
  val_05 = &tip->nHeight;
  tinyformat::format<int,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (&local_d8,(tinyformat *)"writing UTXO snapshot at height %s (%s) to file %s (via %s)",
             (char *)val_05,(int *)&metadata,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&last_hash,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)afile);
  written_coins_count_00 = (size_t *)&DAT_00000001;
  prefix._M_string_length = in_stack_fffffffffffffad0;
  prefix._M_dataplus._M_p = (pointer)afile;
  prefix.field_2._M_allocated_capacity = (size_type)val_05;
  prefix.field_2._8_8_ = in_stack_fffffffffffffae0;
  end_msg._M_string_length = uStack_510;
  end_msg._M_dataplus._M_p = (pointer)local_518;
  end_msg.field_2._M_allocated_capacity =
       (size_type)
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  end_msg.field_2._8_8_ =
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::Timer
            (&logging_timer58,prefix,end_msg,(LogFlags)local_b8,SUB81(&local_d8,0));
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&last_hash);
  std::__cxx11::string::~string((string *)&key);
  std::__cxx11::string::~string((string *)&metadata);
  std::__cxx11::string::~string(local_b8);
  network_magic._M_elems =
       *&(((chainstate->m_chainman->m_options).chainparams)->pchMessageStart)._M_elems;
  CBlockIndex::GetBlockHash((uint256 *)&coin,tip);
  node::SnapshotMetadata::SnapshotMetadata
            (&metadata,network_magic,(uint256 *)&coin,maybe_stats->coins_count);
  node::SnapshotMetadata::Serialize<AutoFile>(&metadata,afile);
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  key.n = 0xffffffff;
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  Coin::Coin(&coin);
  written_coins_count = 0;
  coins.
  super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  coins.
  super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  coins.
  super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*pcursor->_vptr_CCoinsViewCursor[2])(pcursor,&key);
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe];
  last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
       key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf];
  iVar4 = 0;
  uVar5 = 0;
  while( true ) {
    iVar3 = (*pcursor->_vptr_CCoinsViewCursor[4])(pcursor);
    if ((char)iVar3 == '\0') break;
    if ((uVar5 / 5000) * 5000 + iVar4 == 0) {
      _GLOBAL__N_1::std::function<void_()>::operator()((function<void_()> *)interruption_point);
    }
    iVar3 = (*pcursor->_vptr_CCoinsViewCursor[2])(pcursor,&key);
    if ((char)iVar3 != '\0') {
      iVar3 = (*pcursor->_vptr_CCoinsViewCursor[3])(pcursor,&coin);
      if ((char)iVar3 != '\0') {
        bVar2 = transaction_identifier<false>::operator!=(&key.hash,&last_hash);
        if (bVar2) {
          WriteUTXOSnapshot::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)afile,(AutoFile *)&last_hash,(Txid *)&coins,
                     (vector<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
                      *)&written_coins_count,written_coins_count_00);
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe];
          last_hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
               key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf];
          std::
          vector<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>::
          clear(&coins);
        }
        std::vector<std::pair<unsigned_int,Coin>,std::allocator<std::pair<unsigned_int,Coin>>>::
        emplace_back<unsigned_int&,Coin&>
                  ((vector<std::pair<unsigned_int,Coin>,std::allocator<std::pair<unsigned_int,Coin>>>
                    *)&coins,&key.n,&coin);
      }
    }
    iVar4 = iVar4 + -1;
    uVar5 = uVar5 + 1;
    (*pcursor->_vptr_CCoinsViewCursor[5])(pcursor);
  }
  pUVar6 = __return_storage_ptr__;
  pCVar7 = maybe_stats;
  if (coins.
      super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      coins.
      super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    WriteUTXOSnapshot::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)afile,(AutoFile *)&last_hash,(Txid *)&coins,
               (vector<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
                *)&written_coins_count,written_coins_count_00);
  }
  local_2e8._M_dataplus._M_p._0_1_ = written_coins_count == maybe_stats->coins_count;
  __stream = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp";
  inline_check_non_fatal<bool>
            ((bool *)&local_2e8,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp"
             ,0xb8e,"WriteUTXOSnapshot","written_coins_count == maybe_stats->coins_count");
  AutoFile::fclose(afile,(FILE *)__stream);
  local_1d8 = local_1c8;
  local_1d0 = 0;
  local_1c8[0] = 0;
  str._M_string_length = (size_type)pUVar6;
  str._M_dataplus._M_p = (pointer)afile;
  str.field_2._M_allocated_capacity = (size_type)val_05;
  str.field_2._8_8_ = pCVar7;
  UniValue::UniValue(__return_storage_ptr__,VOBJ,str);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,"coins_written",(allocator<char> *)&local_2e8);
  UniValue::UniValue<unsigned_long_&,_unsigned_long,_true>(&local_250,&written_coins_count);
  key_00._M_string_length = (size_type)pUVar6;
  key_00._M_dataplus._M_p = (pointer)afile;
  key_00.field_2._M_allocated_capacity = (size_type)val_05;
  key_00.field_2._8_8_ = pCVar7;
  val.val._M_dataplus._M_p = (pointer)uStack_510;
  val._0_8_ = tip;
  val.val._M_string_length =
       (size_type)
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  val.val.field_2._M_allocated_capacity =
       (size_type)
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  val.val.field_2._8_8_ =
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)written_coins_count;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_4e8[0]._0_8_;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_4e8[0]._8_8_;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
       = (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)local_4e8[0]._16_24_;
  UniValue::pushKV(__return_storage_ptr__,key_00,val);
  UniValue::~UniValue(&local_250);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_270,"base_hash",(allocator<char> *)((long)&uStack_510 + 7));
  CBlockIndex::GetBlockHash((uint256 *)local_308,tip);
  base_blob<256u>::ToString_abi_cxx11_(&local_2e8,local_308);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_2c8,&local_2e8);
  key_01._M_string_length = (size_type)pUVar6;
  key_01._M_dataplus._M_p = (pointer)afile;
  key_01.field_2._M_allocated_capacity = (size_type)val_05;
  key_01.field_2._8_8_ = pCVar7;
  val_00.val._M_dataplus._M_p = (pointer)uStack_510;
  val_00._0_8_ = tip;
  val_00.val._M_string_length =
       (size_type)
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  val_00.val.field_2._M_allocated_capacity =
       (size_type)
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  val_00.val.field_2._8_8_ =
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)written_coins_count;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_4e8[0]._0_8_;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_4e8[0]._8_8_;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)local_4e8[0]._16_24_;
  UniValue::pushKV(__return_storage_ptr__,key_01,val_00);
  UniValue::~UniValue(&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::string<std::allocator<char>>
            (local_328,"base_height",(allocator<char> *)&local_2e8);
  UniValue::UniValue<const_int_&,_int,_true>(&local_380,val_05);
  key_02._M_string_length = (size_type)pUVar6;
  key_02._M_dataplus._M_p = (pointer)afile;
  key_02.field_2._M_allocated_capacity = (size_type)val_05;
  key_02.field_2._8_8_ = pCVar7;
  val_01.val._M_dataplus._M_p = (pointer)uStack_510;
  val_01._0_8_ = tip;
  val_01.val._M_string_length =
       (size_type)
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  val_01.val.field_2._M_allocated_capacity =
       (size_type)
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  val_01.val.field_2._8_8_ =
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)written_coins_count;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_4e8[0]._0_8_;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_4e8[0]._8_8_;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)local_4e8[0]._16_24_;
  UniValue::pushKV(__return_storage_ptr__,key_02,val_01);
  UniValue::~UniValue(&local_380);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"path",(allocator<char> *)local_308);
  fs::path::utf8string_abi_cxx11_(&local_2e8,path);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_3f8,&local_2e8);
  key_03._M_string_length = (size_type)pUVar6;
  key_03._M_dataplus._M_p = (pointer)afile;
  key_03.field_2._M_allocated_capacity = (size_type)val_05;
  key_03.field_2._8_8_ = pCVar7;
  val_02.val._M_dataplus._M_p = (pointer)uStack_510;
  val_02._0_8_ = tip;
  val_02.val._M_string_length =
       (size_type)
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  val_02.val.field_2._M_allocated_capacity =
       (size_type)
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  val_02.val.field_2._8_8_ =
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)written_coins_count;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_4e8[0]._0_8_;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_4e8[0]._8_8_;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)local_4e8[0]._16_24_;
  UniValue::pushKV(__return_storage_ptr__,key_03,val_02);
  UniValue::~UniValue(&local_3f8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_418,"txoutset_hash",(allocator<char> *)local_308);
  base_blob<256u>::ToString_abi_cxx11_(&local_2e8,(base_blob<256u> *)&maybe_stats->hashSerialized);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_470,&local_2e8);
  key_04._M_string_length = (size_type)pUVar6;
  key_04._M_dataplus._M_p = (pointer)afile;
  key_04.field_2._M_allocated_capacity = (size_type)val_05;
  key_04.field_2._8_8_ = pCVar7;
  val_03.val._M_dataplus._M_p = (pointer)uStack_510;
  val_03._0_8_ = tip;
  val_03.val._M_string_length =
       (size_type)
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  val_03.val.field_2._M_allocated_capacity =
       (size_type)
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  val_03.val.field_2._8_8_ =
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)written_coins_count;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_4e8[0]._0_8_;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_4e8[0]._8_8_;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)local_4e8[0]._16_24_;
  UniValue::pushKV(__return_storage_ptr__,key_04,val_03);
  UniValue::~UniValue(&local_470);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string(local_418);
  std::__cxx11::string::string<std::allocator<char>>
            (local_490,"nchaintx",(allocator<char> *)&local_2e8);
  UniValue::UniValue<const_unsigned_long_&,_unsigned_long,_true>
            ((UniValue *)local_4e8,&tip->m_chain_tx_count);
  key_05._M_string_length = (size_type)pUVar6;
  key_05._M_dataplus._M_p = (pointer)afile;
  key_05.field_2._M_allocated_capacity = (size_type)val_05;
  key_05.field_2._8_8_ = pCVar7;
  val_04.val._M_dataplus._M_p = (pointer)uStack_510;
  val_04._0_8_ = tip;
  val_04.val._M_string_length =
       (size_type)
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  val_04.val.field_2._M_allocated_capacity =
       (size_type)
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  val_04.val.field_2._8_8_ =
       coins.
       super__Vector_base<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)written_coins_count;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_4e8[0]._0_8_;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_4e8[0]._8_8_;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)local_4e8[0]._16_24_;
  UniValue::pushKV(__return_storage_ptr__,key_05,val_04);
  UniValue::~UniValue((UniValue *)local_4e8);
  std::__cxx11::string::~string(local_490);
  std::vector<std::pair<unsigned_int,_Coin>,_std::allocator<std::pair<unsigned_int,_Coin>_>_>::
  ~vector(&coins);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&coin.out.scriptPubKey.super_CScriptBase);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
               *)&metadata);
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::~Timer(&logging_timer58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue WriteUTXOSnapshot(
    Chainstate& chainstate,
    CCoinsViewCursor* pcursor,
    CCoinsStats* maybe_stats,
    const CBlockIndex* tip,
    AutoFile& afile,
    const fs::path& path,
    const fs::path& temppath,
    const std::function<void()>& interruption_point)
{
    LOG_TIME_SECONDS(strprintf("writing UTXO snapshot at height %s (%s) to file %s (via %s)",
        tip->nHeight, tip->GetBlockHash().ToString(),
        fs::PathToString(path), fs::PathToString(temppath)));

    SnapshotMetadata metadata{chainstate.m_chainman.GetParams().MessageStart(), tip->GetBlockHash(), maybe_stats->coins_count};

    afile << metadata;

    COutPoint key;
    Txid last_hash;
    Coin coin;
    unsigned int iter{0};
    size_t written_coins_count{0};
    std::vector<std::pair<uint32_t, Coin>> coins;

    // To reduce space the serialization format of the snapshot avoids
    // duplication of tx hashes. The code takes advantage of the guarantee by
    // leveldb that keys are lexicographically sorted.
    // In the coins vector we collect all coins that belong to a certain tx hash
    // (key.hash) and when we have them all (key.hash != last_hash) we write
    // them to file using the below lambda function.
    // See also https://github.com/bitcoin/bitcoin/issues/25675
    auto write_coins_to_file = [&](AutoFile& afile, const Txid& last_hash, const std::vector<std::pair<uint32_t, Coin>>& coins, size_t& written_coins_count) {
        afile << last_hash;
        WriteCompactSize(afile, coins.size());
        for (const auto& [n, coin] : coins) {
            WriteCompactSize(afile, n);
            afile << coin;
            ++written_coins_count;
        }
    };

    pcursor->GetKey(key);
    last_hash = key.hash;
    while (pcursor->Valid()) {
        if (iter % 5000 == 0) interruption_point();
        ++iter;
        if (pcursor->GetKey(key) && pcursor->GetValue(coin)) {
            if (key.hash != last_hash) {
                write_coins_to_file(afile, last_hash, coins, written_coins_count);
                last_hash = key.hash;
                coins.clear();
            }
            coins.emplace_back(key.n, coin);
        }
        pcursor->Next();
    }

    if (!coins.empty()) {
        write_coins_to_file(afile, last_hash, coins, written_coins_count);
    }

    CHECK_NONFATAL(written_coins_count == maybe_stats->coins_count);

    afile.fclose();

    UniValue result(UniValue::VOBJ);
    result.pushKV("coins_written", written_coins_count);
    result.pushKV("base_hash", tip->GetBlockHash().ToString());
    result.pushKV("base_height", tip->nHeight);
    result.pushKV("path", path.utf8string());
    result.pushKV("txoutset_hash", maybe_stats->hashSerialized.ToString());
    result.pushKV("nchaintx", tip->m_chain_tx_count);
    return result;
}